

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O2

void print_panel_seg(int n,int w,int jcol,int nseg,int *segrep,int *repfnz)

{
  uint uVar1;
  ulong uVar2;
  
  if (nseg < 1) {
    nseg = 0;
  }
  for (uVar1 = jcol; (int)uVar1 < w + jcol; uVar1 = uVar1 + 1) {
    printf("\tcol %d:\n",(ulong)uVar1);
    for (uVar2 = 0; (uint)nseg != uVar2; uVar2 = uVar2 + 1) {
      printf("\t\tseg %d, segrep %d, repfnz %d\n",uVar2 & 0xffffffff,(ulong)(uint)segrep[uVar2],
             (ulong)(uint)repfnz[(int)(segrep[uVar2] + (uVar1 - jcol) * n)]);
    }
  }
  return;
}

Assistant:

void print_panel_seg(int n, int w, int jcol, int nseg,
                     const int *segrep, const int *repfnz)
{
    int j, k;
    
    for (j = jcol; j < jcol+w; j++) {
	printf("\tcol %d:\n", j);
	for (k = 0; k < nseg; k++)
	    printf("\t\tseg %d, segrep %d, repfnz %d\n", k, 
			segrep[k], repfnz[(j-jcol)*n + segrep[k]]);
    }

}